

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipatchtexture.cpp
# Opt level: O2

void __thiscall FMultiPatchTexture::CheckForHacks(FMultiPatchTexture *this)

{
  WORD WVar1;
  uint uVar2;
  char *pcVar3;
  TexPart *pTVar4;
  long *plVar5;
  ulong uVar6;
  SWORD *pSVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  uVar2 = this->NumParts;
  uVar6 = (ulong)uVar2;
  if (0 < (int)uVar2) {
    if (gameinfo.gametype == GAME_Doom) {
      WVar1 = (this->super_FTexture).Height;
      if (WVar1 == 0x80 && (uVar2 == 1 && (gameinfo.flags & 1U) == 0)) {
        if ((((this->Parts->OriginY == -8) &&
             (pcVar3 = (this->super_FTexture).Name.Chars, *pcVar3 == 'S')) && (pcVar3[1] == 'K')) &&
           (((pcVar3[2] == 'Y' && (pcVar3[3] == '1')) && (pcVar3[4] == '\0')))) {
          this->Parts->OriginY = 0;
          return;
        }
      }
      else if (((((uVar2 == 2 && (gameinfo.flags & 1U) == 0) && WVar1 == 0x80) &&
                (pTVar4 = this->Parts, pTVar4->OriginY == -4)) && (pTVar4[1].OriginY == -4)) &&
              (((((pcVar3 = (this->super_FTexture).Name.Chars, *pcVar3 == 'B' && (pcVar3[1] == 'I'))
                 && ((pcVar3[2] == 'G' && ((pcVar3[3] == 'D' && (pcVar3[4] == 'O')))))) &&
                (pcVar3[5] == 'O')) && ((pcVar3[6] == 'R' && (pcVar3[7] == '7')))))) {
        pTVar4->OriginY = 0;
        pTVar4[1].OriginY = 0;
        return;
      }
    }
    else if (((gameinfo.gametype == GAME_Heretic) &&
             (pcVar3 = (this->super_FTexture).Name.Chars, *pcVar3 == 'S')) &&
            ((pcVar3[1] == 'K' &&
             ((((pcVar3[2] == 'Y' && (pcVar3[4] == '\0')) && ((byte)(pcVar3[3] - 0x31U) < 3)) &&
              ((this->super_FTexture).Height == 0x80)))))) {
      (this->super_FTexture).Height = 200;
      (this->super_FTexture).HeightBits = '\b';
      return;
    }
    if ((this->super_FTexture).Height == 0x100) {
      pSVar7 = &this->Parts->OriginY;
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        if (*pSVar7 != 0) {
          if (uVar2 != (uint)uVar8) {
            return;
          }
          break;
        }
        pSVar7 = pSVar7 + 0x14;
      }
      lVar9 = 0x18;
      for (lVar10 = 0; lVar10 < (int)uVar6; lVar10 = lVar10 + 1) {
        plVar5 = *(long **)((long)&this->Parts->OriginX + lVar9);
        (**(code **)(*plVar5 + 0x70))(plVar5,0x100);
        uVar6 = (ulong)(uint)this->NumParts;
        lVar9 = lVar9 + 0x28;
      }
    }
  }
  return;
}

Assistant:

void FMultiPatchTexture::CheckForHacks ()
{
	if (NumParts <= 0)
	{
		return;
	}

	// Heretic sky textures are marked as only 128 pixels tall,
	// even though they are really 200 pixels tall.
	if (gameinfo.gametype == GAME_Heretic &&
		Name[0] == 'S' &&
		Name[1] == 'K' &&
		Name[2] == 'Y' &&
		Name[4] == 0 &&
		Name[3] >= '1' &&
		Name[3] <= '3' &&
		Height == 128)
	{
		Height = 200;
		HeightBits = 8;
		return;
	}

	// The Doom E1 sky has its patch's y offset at -8 instead of 0.
	if (gameinfo.gametype == GAME_Doom &&
		!(gameinfo.flags & GI_MAPxx) &&
		NumParts == 1 &&
		Height == 128 &&
		Parts->OriginY == -8 &&
		Name[0] == 'S' &&
		Name[1] == 'K' &&
		Name[2] == 'Y' &&
		Name[3] == '1' &&
		Name[4] == 0)
	{
		Parts->OriginY = 0;
		return;
	}

	// BIGDOOR7 in Doom also has patches at y offset -4 instead of 0.
	if (gameinfo.gametype == GAME_Doom &&
		!(gameinfo.flags & GI_MAPxx) &&
		NumParts == 2 &&
		Height == 128 &&
		Parts[0].OriginY == -4 &&
		Parts[1].OriginY == -4 &&
		Name[0] == 'B' &&
		Name[1] == 'I' &&
		Name[2] == 'G' &&
		Name[3] == 'D' &&
		Name[4] == 'O' &&
		Name[5] == 'O' &&
		Name[6] == 'R' &&
		Name[7] == '7')
	{
		Parts[0].OriginY = 0;
		Parts[1].OriginY = 0;
		return;
	}

	// [RH] Some wads (I forget which!) have single-patch textures 256
	// pixels tall that have patch lengths recorded as 0. I can't think of
	// any good reason for them to do this, and since I didn't make note
	// of which wad made me hack in support for them, the hack is gone
	// because I've added support for DeePsea's true tall patches.
	//
	// Okay, I found a wad with crap patches: Pleiades.wad's sky patches almost
	// fit this description and are a big mess, but they're not single patch!
	if (Height == 256)
	{
		int i;

		// All patches must be at the top of the texture for this fix
		for (i = 0; i < NumParts; ++i)
		{
			if (Parts[i].OriginY != 0)
			{
				break;
			}
		}

		if (i == NumParts)
		{
			for (i = 0; i < NumParts; ++i)
			{
				Parts[i].Texture->HackHack(256);
			}
		}
	}
}